

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

bool lsim::serialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  pointer pbVar1;
  pointer puVar2;
  ModelCircuitLibrary *pMVar3;
  ModelCircuit *pMVar4;
  ModelComponent *pMVar5;
  const_iterator cVar6;
  char_t *rhs;
  xml_node xVar7;
  ModelWire *this;
  Point *pPVar8;
  pin_id_t pVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref;
  pointer pbVar10;
  size_t idx_00;
  pointer puVar11;
  size_t idx;
  __node_base *p_Var12;
  ulong uVar13;
  xml_node ref_node;
  xml_node orient_node;
  xml_node_struct *local_1a0;
  xml_node circuit_node;
  xml_node wire_node;
  xml_node comp_node;
  xml_attribute local_138;
  xml_node pin_node;
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_ids;
  Serializer serializer;
  
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x232,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (lib != (ModelCircuitLibrary *)0x0) {
    if (filename != (char *)0x0) {
      serializer.m_context = context;
      pugi::xml_document::xml_document(&serializer.m_xml);
      pugi::xml_node::xml_node(&serializer.m_root);
      serializer.m_root = pugi::xml_node::append_child(&serializer.m_xml.super_xml_node,"lsim");
      ref_node._root =
           (xml_node_struct *)pugi::xml_node::append_attribute(&serializer.m_root,"version");
      pugi::xml_attribute::set_value((xml_attribute *)&ref_node,"2");
      pbVar1 = (lib->m_references).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (lib->m_references).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
          pbVar10 = pbVar10 + 1) {
        pMVar3 = LSimContext::library_by_name(serializer.m_context,(pbVar10->_M_dataplus)._M_p);
        if (pMVar3 != (ModelCircuitLibrary *)0x0) {
          ref_node = pugi::xml_node::append_child(&serializer.m_root,"reference");
          comp_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"name");
          pugi::xml_attribute::set_value((xml_attribute *)&comp_node,(pbVar10->_M_dataplus)._M_p);
          comp_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"file");
          pugi::xml_attribute::set_value
                    ((xml_attribute *)&comp_node,(pMVar3->m_path)._M_dataplus._M_p);
        }
      }
      for (idx_00 = 0;
          idx_00 < (ulong)((long)(lib->m_circuits).
                                 super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(lib->m_circuits).
                                 super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          idx_00 = idx_00 + 1) {
        pMVar4 = ModelCircuitLibrary::circuit_by_idx(lib,idx_00);
        circuit_node = pugi::xml_node::append_child(&serializer.m_root,"circuit");
        ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&circuit_node,"name");
        pugi::xml_attribute::set_value((xml_attribute *)&ref_node,(pMVar4->m_name)._M_dataplus._M_p)
        ;
        ModelCircuit::component_ids(&comp_ids,pMVar4);
        puVar2 = comp_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar11 = comp_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
            puVar11 = puVar11 + 1) {
          pMVar5 = ModelCircuit::component_by_id(pMVar4,*puVar11);
          comp_node = pugi::xml_node::append_child(&circuit_node,"component");
          ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&comp_node,"id");
          pugi::xml_attribute::set_value((xml_attribute *)&ref_node,pMVar5->m_id);
          ref_node._root._0_4_ = pMVar5->m_type;
          cVar6 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)(anonymous_namespace)::component_type_to_name_abi_cxx11_,
                         (key_type_conflict1 *)&ref_node);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&comp_node,"type");
            pugi::xml_attribute::set_value((xml_attribute *)&ref_node,pMVar5->m_type);
          }
          else {
            ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&comp_node,"type");
            pugi::xml_attribute::set_value
                      ((xml_attribute *)&ref_node,
                       *(char_t **)
                        ((long)cVar6.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x10));
          }
          ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&comp_node,"inputs");
          pugi::xml_attribute::set_value((xml_attribute *)&ref_node,pMVar5->m_inputs);
          ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&comp_node,"outputs")
          ;
          pugi::xml_attribute::set_value((xml_attribute *)&ref_node,pMVar5->m_outputs);
          ref_node._root =
               (xml_node_struct *)pugi::xml_node::append_attribute(&comp_node,"controls");
          pugi::xml_attribute::set_value((xml_attribute *)&ref_node,pMVar5->m_controls);
          if (pMVar5->m_nested_circuit != (ModelCircuit *)0x0) {
            orient_node._root =
                 (xml_node_struct *)pugi::xml_node::append_attribute(&comp_node,"nested");
            ModelCircuit::qualified_name_abi_cxx11_((string *)&ref_node,pMVar5->m_nested_circuit);
            pugi::xml_attribute::set_value((xml_attribute *)&orient_node,(char_t *)ref_node._root);
            std::__cxx11::string::~string((string *)&ref_node);
          }
          p_Var12 = &(pMVar5->m_properties)._M_h._M_before_begin;
          while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
            orient_node = pugi::xml_node::append_child(&comp_node,"property");
            ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&orient_node,"key")
            ;
            rhs = (char_t *)(*(code *)(p_Var12[5]._M_nxt)->_M_nxt[2]._M_nxt)();
            pugi::xml_attribute::set_value((xml_attribute *)&ref_node,rhs);
            wire_node._root =
                 (xml_node_struct *)pugi::xml_node::append_attribute(&orient_node,"value");
            (*(code *)(p_Var12[5]._M_nxt)->_M_nxt[4]._M_nxt)((string *)&ref_node);
            pugi::xml_attribute::set_value((xml_attribute *)&wire_node,(char_t *)ref_node._root);
            std::__cxx11::string::~string((string *)&ref_node);
          }
          ref_node = pugi::xml_node::append_child(&comp_node,"position");
          orient_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"x");
          pugi::xml_attribute::set_value((xml_attribute *)&orient_node,(pMVar5->m_position).x);
          orient_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"y");
          pugi::xml_attribute::set_value((xml_attribute *)&orient_node,(pMVar5->m_position).y);
          orient_node = pugi::xml_node::append_child(&comp_node,"orientation");
          wire_node._root =
               (xml_node_struct *)pugi::xml_node::append_attribute(&orient_node,"angle");
          pugi::xml_attribute::set_value((xml_attribute *)&wire_node,pMVar5->m_angle);
        }
        ModelCircuit::wire_ids
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&orient_node,pMVar4);
        for (xVar7 = orient_node; xVar7._root != local_1a0;
            xVar7._root = (xml_node_struct *)((long)&(xVar7._root)->header + 4)) {
          this = ModelCircuit::wire_by_id(pMVar4,(uint32_t)(xVar7._root)->header);
          wire_node = pugi::xml_node::append_child(&circuit_node,"wire");
          ref_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&wire_node,"id");
          pugi::xml_attribute::set_value((xml_attribute *)&ref_node,this->m_id);
          for (uVar13 = 0;
              uVar13 < (ulong)((long)(this->m_segments).
                                     super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_segments).
                                     super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar13 = uVar13 + 1) {
            ref_node = pugi::xml_node::append_child(&wire_node,"segment");
            pPVar8 = ModelWire::segment_point(this,uVar13,0);
            comp_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"x1");
            pugi::xml_attribute::set_value((xml_attribute *)&comp_node,pPVar8->x);
            comp_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"y1");
            pugi::xml_attribute::set_value((xml_attribute *)&comp_node,pPVar8->y);
            pPVar8 = ModelWire::segment_point(this,uVar13,1);
            comp_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"x2");
            pugi::xml_attribute::set_value((xml_attribute *)&comp_node,pPVar8->x);
            comp_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"y2");
            pugi::xml_attribute::set_value((xml_attribute *)&comp_node,pPVar8->y);
          }
          for (uVar13 = 0;
              uVar13 < (ulong)((long)(this->m_pins).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_pins).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar13 = uVar13 + 1) {
            pin_node = pugi::xml_node::append_child(&wire_node,"pin");
            local_138 = pugi::xml_node::append_attribute(&pin_node,"value");
            pVar9 = ModelWire::pin(this,uVar13);
            std::__cxx11::to_string((string *)&comp_node,(uint)(pVar9 >> 0x20));
            std::__cxx11::string::append((char *)&comp_node);
            std::__cxx11::to_string((string *)&ref_node,(uint)pVar9);
            std::__cxx11::string::append((string *)&comp_node);
            std::__cxx11::string::~string((string *)&ref_node);
            pugi::xml_attribute::set_value(&local_138,(char_t *)comp_node._root);
            std::__cxx11::string::~string((string *)&comp_node);
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&orient_node);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&comp_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      pMVar4 = ModelCircuitLibrary::main_circuit(lib);
      if (pMVar4 != (ModelCircuit *)0x0) {
        ref_node = pugi::xml_node::append_child(&serializer.m_root,"main");
        comp_node._root = (xml_node_struct *)pugi::xml_node::append_attribute(&ref_node,"name");
        pugi::xml_attribute::set_value
                  ((xml_attribute *)&comp_node,(lib->m_main_circuit)._M_dataplus._M_p);
      }
      pugi::xml_document::save_file(&serializer.m_xml,filename,"\t",1,encoding_auto);
      pugi::xml_document::~xml_document(&serializer.m_xml);
      return true;
    }
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x234,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  __assert_fail("lib",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                ,0x233,
                "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)");
}

Assistant:

bool serialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Serializer serializer(context);
    serializer.serialize_library(lib);
    serializer.dump_to_file(filename);

    return true;
}